

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_compress_advanced
                 (ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,void *dict,
                 size_t dictSize,ZSTD_parameters params)

{
  ZSTD_compressionParameters cParams;
  ZSTD_parameters ZVar1;
  uint uVar2;
  undefined8 in_stack_ffffffffffffff84;
  size_t err_code;
  void *dict_local;
  size_t srcSize_local;
  void *src_local;
  size_t dstCapacity_local;
  void *dst_local;
  ZSTD_CCtx *cctx_local;
  
  ZVar1 = params;
  cParams._20_8_ = in_stack_ffffffffffffff84;
  cParams.windowLog = params.cParams.hashLog;
  cParams.chainLog = params.cParams.searchLog;
  cParams.hashLog = params.cParams.minMatch;
  cParams.searchLog = params.cParams.targetLength;
  cParams.minMatch = params.cParams.strategy;
  params = ZVar1;
  cctx_local = (ZSTD_CCtx *)ZSTD_checkCParams(cParams);
  uVar2 = ERR_isError((size_t)cctx_local);
  if (uVar2 == 0) {
    cctx_local = (ZSTD_CCtx *)
                 ZSTD_compress_internal(cctx,dst,dstCapacity,src,srcSize,dict,dictSize,&params);
  }
  return (size_t)cctx_local;
}

Assistant:

size_t ZSTD_compress_advanced (ZSTD_CCtx* cctx,
                               void* dst, size_t dstCapacity,
                         const void* src, size_t srcSize,
                         const void* dict,size_t dictSize,
                               ZSTD_parameters params)
{
    DEBUGLOG(4, "ZSTD_compress_advanced");
    FORWARD_IF_ERROR(ZSTD_checkCParams(params.cParams));
    return ZSTD_compress_internal(cctx,
                                  dst, dstCapacity,
                                  src, srcSize,
                                  dict, dictSize,
                                  &params);
}